

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_16777232,_true,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::QuadMiMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float fVar1;
  undefined4 uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined4 uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  Scene *pSVar15;
  Ref<embree::Geometry> *pRVar16;
  Geometry *pGVar17;
  long lVar18;
  long lVar19;
  RTCFilterFunctionN p_Var20;
  undefined1 auVar21 [16];
  float fVar22;
  float fVar23;
  float fVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined1 auVar27 [32];
  AABBNodeMB4D *node1;
  ulong uVar28;
  ulong uVar29;
  long lVar30;
  long lVar31;
  ulong uVar32;
  long lVar33;
  ulong unaff_RBX;
  size_t mask;
  int iVar34;
  ulong *puVar35;
  ulong uVar36;
  long lVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  uint uVar41;
  ulong uVar42;
  bool bVar43;
  bool bVar44;
  byte bVar45;
  ulong uVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar73 [32];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [32];
  undefined1 auVar102 [16];
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  undefined8 local_b20;
  undefined8 uStack_b18;
  ulong local_b10;
  ulong local_b08;
  ulong *local_b00;
  ulong local_af8;
  undefined1 local_af0 [16];
  undefined1 local_ae0 [16];
  RTCFilterFunctionNArguments local_ad0;
  undefined1 local_aa0 [16];
  RTCHitN local_a90 [16];
  undefined1 local_a80 [16];
  undefined1 local_a70 [16];
  undefined1 local_a60 [16];
  undefined1 local_a50 [16];
  undefined1 local_a40 [16];
  undefined1 local_a30 [16];
  uint local_a20;
  uint uStack_a1c;
  uint uStack_a18;
  uint uStack_a14;
  uint uStack_a10;
  uint uStack_a0c;
  uint uStack_a08;
  uint uStack_a04;
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  char local_900;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  float local_880 [4];
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  undefined4 uStack_864;
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820;
  size_t local_800;
  ulong local_7f8 [249];
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  local_800 = root.ptr;
  auVar47 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar103 = ZEXT1664(auVar47);
  auVar47 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  auVar104 = ZEXT1664(auVar47);
  uVar7 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar47._4_4_ = uVar7;
  auVar47._0_4_ = uVar7;
  auVar47._8_4_ = uVar7;
  auVar47._12_4_ = uVar7;
  fVar8 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar9 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar10 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar22 = fVar8 * 0.99999964;
  fVar23 = fVar9 * 0.99999964;
  fVar24 = fVar10 * 0.99999964;
  fVar8 = fVar8 * 1.0000004;
  fVar9 = fVar9 * 1.0000004;
  fVar10 = fVar10 * 1.0000004;
  uVar32 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar38 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar39 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar34 = (tray->tnear).field_0.i[k];
  auVar100._4_4_ = iVar34;
  auVar100._0_4_ = iVar34;
  auVar100._8_4_ = iVar34;
  auVar100._12_4_ = iVar34;
  iVar34 = (tray->tfar).field_0.i[k];
  auVar102._4_4_ = iVar34;
  auVar102._0_4_ = iVar34;
  auVar102._8_4_ = iVar34;
  auVar102._12_4_ = iVar34;
  local_af8 = uVar39 ^ 0x10;
  local_aa0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  puVar35 = local_7f8;
  do {
    local_b00 = puVar35;
    if (local_b00 == &local_800) break;
    puVar35 = local_b00 + -1;
    uVar42 = local_b00[-1];
    do {
      if ((uVar42 & 8) == 0) {
        uVar28 = uVar42 & 0xfffffffffffffff0;
        uVar7 = *(undefined4 *)(ray + k * 4 + 0x70);
        auVar58._4_4_ = uVar7;
        auVar58._0_4_ = uVar7;
        auVar58._8_4_ = uVar7;
        auVar58._12_4_ = uVar7;
        auVar48 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar28 + 0x80 + uVar32),auVar58,
                                  *(undefined1 (*) [16])(uVar28 + 0x20 + uVar32));
        auVar48 = vsubps_avx512vl(auVar48,auVar103._0_16_);
        auVar49._0_4_ = fVar22 * auVar48._0_4_;
        auVar49._4_4_ = fVar22 * auVar48._4_4_;
        auVar49._8_4_ = fVar22 * auVar48._8_4_;
        auVar49._12_4_ = fVar22 * auVar48._12_4_;
        auVar48 = vmaxps_avx(auVar100,auVar49);
        auVar49 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar28 + 0x80 + uVar38),auVar58,
                                  *(undefined1 (*) [16])(uVar28 + 0x20 + uVar38));
        auVar49 = vsubps_avx512vl(auVar49,auVar104._0_16_);
        auVar50._0_4_ = fVar23 * auVar49._0_4_;
        auVar50._4_4_ = fVar23 * auVar49._4_4_;
        auVar50._8_4_ = fVar23 * auVar49._8_4_;
        auVar50._12_4_ = fVar23 * auVar49._12_4_;
        auVar49 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar28 + 0x80 + uVar39),auVar58,
                                  *(undefined1 (*) [16])(uVar28 + 0x20 + uVar39));
        auVar49 = vsubps_avx(auVar49,auVar47);
        auVar64._0_4_ = fVar24 * auVar49._0_4_;
        auVar64._4_4_ = fVar24 * auVar49._4_4_;
        auVar64._8_4_ = fVar24 * auVar49._8_4_;
        auVar64._12_4_ = fVar24 * auVar49._12_4_;
        auVar49 = vmaxps_avx(auVar50,auVar64);
        auVar48 = vmaxps_avx(auVar48,auVar49);
        auVar49 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar28 + 0x80 + (uVar32 ^ 0x10)),auVar58,
                                  *(undefined1 (*) [16])(uVar28 + 0x20 + (uVar32 ^ 0x10)));
        auVar49 = vsubps_avx512vl(auVar49,auVar103._0_16_);
        auVar61._0_4_ = fVar8 * auVar49._0_4_;
        auVar61._4_4_ = fVar8 * auVar49._4_4_;
        auVar61._8_4_ = fVar8 * auVar49._8_4_;
        auVar61._12_4_ = fVar8 * auVar49._12_4_;
        auVar49 = vminps_avx(auVar102,auVar61);
        auVar50 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar28 + 0x80 + (uVar38 ^ 0x10)),auVar58,
                                  *(undefined1 (*) [16])(uVar28 + 0x20 + (uVar38 ^ 0x10)));
        auVar50 = vsubps_avx512vl(auVar50,auVar104._0_16_);
        auVar71._0_4_ = fVar9 * auVar50._0_4_;
        auVar71._4_4_ = fVar9 * auVar50._4_4_;
        auVar71._8_4_ = fVar9 * auVar50._8_4_;
        auVar71._12_4_ = fVar9 * auVar50._12_4_;
        auVar50 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar28 + 0x80 + local_af8),auVar58,
                                  *(undefined1 (*) [16])(uVar28 + 0x20 + local_af8));
        auVar50 = vsubps_avx(auVar50,auVar47);
        auVar67._0_4_ = fVar10 * auVar50._0_4_;
        auVar67._4_4_ = fVar10 * auVar50._4_4_;
        auVar67._8_4_ = fVar10 * auVar50._8_4_;
        auVar67._12_4_ = fVar10 * auVar50._12_4_;
        auVar50 = vminps_avx(auVar71,auVar67);
        auVar49 = vminps_avx(auVar49,auVar50);
        uVar25 = vcmpps_avx512vl(auVar48,auVar49,2);
        bVar45 = (byte)uVar25;
        if (((uint)uVar42 & 7) == 6) {
          uVar25 = vcmpps_avx512vl(auVar58,*(undefined1 (*) [16])(uVar28 + 0xf0),1);
          uVar26 = vcmpps_avx512vl(auVar58,*(undefined1 (*) [16])(uVar28 + 0xe0),0xd);
          bVar45 = (byte)uVar25 & (byte)uVar26 & bVar45;
        }
        unaff_RBX = CONCAT44((int)(unaff_RBX >> 0x20),(uint)bVar45);
      }
      if ((uVar42 & 8) == 0) {
        if (unaff_RBX == 0) {
          uVar41 = 4;
        }
        else {
          uVar28 = uVar42 & 0xfffffffffffffff0;
          lVar31 = 0;
          for (uVar42 = unaff_RBX; (uVar42 & 1) == 0; uVar42 = uVar42 >> 1 | 0x8000000000000000) {
            lVar31 = lVar31 + 1;
          }
          uVar41 = 0;
          for (uVar29 = unaff_RBX - 1 & unaff_RBX; uVar42 = *(ulong *)(uVar28 + lVar31 * 8),
              uVar29 != 0; uVar29 = uVar29 - 1 & uVar29) {
            *puVar35 = uVar42;
            puVar35 = puVar35 + 1;
            lVar31 = 0;
            for (uVar42 = uVar29; (uVar42 & 1) == 0; uVar42 = uVar42 >> 1 | 0x8000000000000000) {
              lVar31 = lVar31 + 1;
            }
          }
        }
      }
      else {
        uVar41 = 6;
      }
    } while (uVar41 == 0);
    if (uVar41 == 6) {
      uVar41 = 0;
      local_b10 = (ulong)((uint)uVar42 & 0xf) - 8;
      bVar43 = local_b10 != 0;
      if (bVar43) {
        uVar42 = uVar42 & 0xfffffffffffffff0;
        local_b08 = 0;
        do {
          lVar30 = local_b08 * 0x60;
          pSVar15 = context->scene;
          pRVar16 = (pSVar15->geometries).items;
          pGVar17 = pRVar16[*(uint *)(uVar42 + 0x40 + lVar30)].ptr;
          fVar11 = (pGVar17->time_range).lower;
          fVar11 = pGVar17->fnumTimeSegments *
                   ((*(float *)(ray + k * 4 + 0x70) - fVar11) /
                   ((pGVar17->time_range).upper - fVar11));
          auVar48 = vroundss_avx(ZEXT416((uint)fVar11),ZEXT416((uint)fVar11),9);
          auVar48 = vminss_avx(auVar48,ZEXT416((uint)(pGVar17->fnumTimeSegments + -1.0)));
          auVar21 = vmaxss_avx(ZEXT816(0),auVar48);
          iVar34 = (int)auVar21._0_4_;
          lVar33 = (long)iVar34 * 0x38;
          lVar31 = *(long *)(*(long *)&pGVar17[2].numPrimitives + lVar33);
          auVar48 = *(undefined1 (*) [16])(lVar31 + (ulong)*(uint *)(uVar42 + lVar30) * 4);
          uVar46 = (ulong)*(uint *)(uVar42 + 0x10 + lVar30);
          auVar49 = *(undefined1 (*) [16])(lVar31 + uVar46 * 4);
          uVar29 = (ulong)*(uint *)(uVar42 + 0x20 + lVar30);
          auVar50 = *(undefined1 (*) [16])(lVar31 + uVar29 * 4);
          uVar36 = (ulong)*(uint *)(uVar42 + 0x30 + lVar30);
          auVar58 = *(undefined1 (*) [16])(lVar31 + uVar36 * 4);
          uVar28 = (ulong)*(uint *)(uVar42 + 4 + lVar30);
          lVar37 = (long)(iVar34 + 1) * 0x38;
          lVar31 = *(long *)(*(long *)&pGVar17[2].numPrimitives + lVar37);
          auVar61 = *(undefined1 (*) [16])(lVar31 + (ulong)*(uint *)(uVar42 + lVar30) * 4);
          auVar64 = *(undefined1 (*) [16])(lVar31 + uVar46 * 4);
          lVar18 = *(long *)&pRVar16[*(uint *)(uVar42 + 0x44 + lVar30)].ptr[2].numPrimitives;
          lVar19 = *(long *)(lVar18 + lVar33);
          auVar71 = *(undefined1 (*) [16])(lVar19 + uVar28 * 4);
          auVar67 = *(undefined1 (*) [16])(lVar31 + uVar29 * 4);
          uVar46 = (ulong)*(uint *)(uVar42 + 0x14 + lVar30);
          auVar72 = *(undefined1 (*) [16])(lVar19 + uVar46 * 4);
          auVar69 = *(undefined1 (*) [16])(lVar31 + uVar36 * 4);
          uVar29 = (ulong)*(uint *)(uVar42 + 0x24 + lVar30);
          auVar57 = *(undefined1 (*) [16])(lVar19 + uVar29 * 4);
          uVar36 = (ulong)*(uint *)(uVar42 + 0x34 + lVar30);
          auVar60 = *(undefined1 (*) [16])(lVar19 + uVar36 * 4);
          lVar31 = *(long *)&pRVar16[*(uint *)(uVar42 + 0x48 + lVar30)].ptr[2].numPrimitives;
          lVar18 = *(long *)(lVar18 + lVar37);
          auVar63 = *(undefined1 (*) [16])(lVar18 + uVar28 * 4);
          lVar19 = *(long *)(lVar31 + lVar33);
          auVar65 = *(undefined1 (*) [16])(lVar18 + uVar46 * 4);
          uVar46 = (ulong)*(uint *)(uVar42 + 8 + lVar30);
          auVar13 = *(undefined1 (*) [16])(lVar19 + uVar46 * 4);
          auVar68 = *(undefined1 (*) [16])(lVar18 + uVar29 * 4);
          uVar28 = (ulong)*(uint *)(uVar42 + 0x18 + lVar30);
          auVar14 = *(undefined1 (*) [16])(lVar19 + uVar28 * 4);
          auVar70 = *(undefined1 (*) [16])(lVar18 + uVar36 * 4);
          uVar29 = (ulong)*(uint *)(uVar42 + 0x28 + lVar30);
          auVar56 = *(undefined1 (*) [16])(lVar19 + uVar29 * 4);
          uVar40 = (ulong)*(uint *)(uVar42 + 0x38 + lVar30);
          auVar59 = *(undefined1 (*) [16])(lVar19 + uVar40 * 4);
          lVar31 = *(long *)(lVar31 + lVar37);
          auVar62 = *(undefined1 (*) [16])(lVar31 + uVar46 * 4);
          lVar18 = *(long *)&pRVar16[*(uint *)(uVar42 + 0x4c + lVar30)].ptr[2].numPrimitives;
          lVar19 = *(long *)(lVar18 + lVar33);
          auVar66 = *(undefined1 (*) [16])(lVar31 + uVar28 * 4);
          uVar36 = (ulong)*(uint *)(uVar42 + 0xc + lVar30);
          auVar53 = *(undefined1 (*) [16])(lVar19 + uVar36 * 4);
          auVar99 = *(undefined1 (*) [16])(lVar31 + uVar29 * 4);
          uVar29 = (ulong)*(uint *)(uVar42 + 0x1c + lVar30);
          auVar55 = *(undefined1 (*) [16])(lVar19 + uVar29 * 4);
          auVar51 = vunpcklps_avx512vl(auVar48,auVar13);
          auVar13 = vunpckhps_avx(auVar48,auVar13);
          auVar52 = vunpcklps_avx512vl(auVar71,auVar53);
          auVar71 = vunpckhps_avx(auVar71,auVar53);
          auVar48 = *(undefined1 (*) [16])(lVar31 + uVar40 * 4);
          uVar28 = (ulong)*(uint *)(uVar42 + 0x2c + lVar30);
          auVar13 = vunpcklps_avx(auVar13,auVar71);
          auVar53 = vunpcklps_avx512vl(auVar51,auVar52);
          auVar51 = vunpckhps_avx512vl(auVar51,auVar52);
          auVar52 = vunpcklps_avx512vl(auVar49,auVar14);
          auVar54 = vunpckhps_avx512vl(auVar49,auVar14);
          auVar14 = vunpcklps_avx(auVar72,auVar55);
          auVar71 = vunpckhps_avx(auVar72,auVar55);
          auVar49 = *(undefined1 (*) [16])(lVar19 + uVar28 * 4);
          uVar46 = (ulong)*(uint *)(uVar42 + 0x3c + lVar30);
          auVar72 = vunpcklps_avx(auVar54,auVar71);
          auVar55 = vunpcklps_avx512vl(auVar52,auVar14);
          auVar71 = vunpckhps_avx(auVar52,auVar14);
          auVar52 = vunpcklps_avx512vl(auVar50,auVar56);
          auVar50 = vunpckhps_avx512vl(auVar50,auVar56);
          auVar56 = vunpcklps_avx512vl(auVar57,auVar49);
          auVar57 = vunpckhps_avx512vl(auVar57,auVar49);
          auVar49 = *(undefined1 (*) [16])(lVar19 + uVar46 * 4);
          lVar31 = *(long *)(lVar18 + lVar37);
          auVar57 = vunpcklps_avx(auVar50,auVar57);
          auVar14 = vunpcklps_avx(auVar52,auVar56);
          auVar50 = vunpckhps_avx(auVar52,auVar56);
          auVar56 = vunpcklps_avx512vl(auVar58,auVar59);
          auVar58 = vunpckhps_avx512vl(auVar58,auVar59);
          auVar59 = vunpcklps_avx512vl(auVar60,auVar49);
          auVar60 = vunpckhps_avx512vl(auVar60,auVar49);
          auVar49 = *(undefined1 (*) [16])(lVar31 + uVar36 * 4);
          auVar58 = vunpcklps_avx(auVar58,auVar60);
          auVar60 = vunpcklps_avx512vl(auVar56,auVar59);
          auVar56 = vunpckhps_avx512vl(auVar56,auVar59);
          auVar59 = vunpcklps_avx512vl(auVar61,auVar62);
          auVar61 = vunpckhps_avx512vl(auVar61,auVar62);
          auVar62 = vunpcklps_avx512vl(auVar63,auVar49);
          auVar63 = vunpckhps_avx512vl(auVar63,auVar49);
          auVar49 = *(undefined1 (*) [16])(lVar31 + uVar29 * 4);
          auVar63 = vunpcklps_avx512vl(auVar61,auVar63);
          auVar52 = vunpcklps_avx512vl(auVar59,auVar62);
          auVar59 = vunpckhps_avx512vl(auVar59,auVar62);
          auVar61 = vunpcklps_avx512vl(auVar64,auVar66);
          auVar64 = vunpckhps_avx512vl(auVar64,auVar66);
          auVar62 = vunpcklps_avx512vl(auVar65,auVar49);
          auVar65 = vunpckhps_avx512vl(auVar65,auVar49);
          auVar49 = *(undefined1 (*) [16])(lVar31 + uVar28 * 4);
          auVar64 = vunpcklps_avx512vl(auVar64,auVar65);
          auVar65 = vunpcklps_avx512vl(auVar61,auVar62);
          auVar62 = vunpckhps_avx512vl(auVar61,auVar62);
          auVar66 = vunpcklps_avx512vl(auVar67,auVar99);
          auVar61 = vunpckhps_avx512vl(auVar67,auVar99);
          auVar67 = vunpcklps_avx512vl(auVar68,auVar49);
          auVar68 = vunpckhps_avx512vl(auVar68,auVar49);
          auVar49 = *(undefined1 (*) [16])(lVar31 + uVar46 * 4);
          auVar61 = vunpcklps_avx(auVar61,auVar68);
          auVar68 = vunpcklps_avx512vl(auVar66,auVar67);
          auVar67 = vunpckhps_avx512vl(auVar66,auVar67);
          auVar66 = vunpcklps_avx512vl(auVar69,auVar48);
          auVar48 = vunpckhps_avx512vl(auVar69,auVar48);
          auVar69 = vunpcklps_avx512vl(auVar70,auVar49);
          auVar49 = vunpckhps_avx512vl(auVar70,auVar49);
          auVar48 = vunpcklps_avx(auVar48,auVar49);
          auVar70 = vunpcklps_avx512vl(auVar66,auVar69);
          auVar69 = vunpckhps_avx512vl(auVar66,auVar69);
          auVar49 = ZEXT416((uint)(fVar11 - auVar21._0_4_));
          auVar66 = vbroadcastss_avx512vl(auVar49);
          auVar49 = vsubss_avx512f(ZEXT416(0x3f800000),auVar49);
          auVar99._0_4_ = auVar49._0_4_;
          auVar99._4_4_ = auVar99._0_4_;
          auVar99._8_4_ = auVar99._0_4_;
          auVar99._12_4_ = auVar99._0_4_;
          auVar49 = vmulps_avx512vl(auVar66,auVar52);
          auVar53 = vfmadd231ps_avx512vl(auVar49,auVar99,auVar53);
          auVar49 = vmulps_avx512vl(auVar66,auVar59);
          auVar59 = vfmadd231ps_avx512vl(auVar49,auVar99,auVar51);
          auVar49 = vmulps_avx512vl(auVar66,auVar63);
          auVar49 = vfmadd231ps_fma(auVar49,auVar99,auVar13);
          auVar63 = vmulps_avx512vl(auVar66,auVar65);
          auVar63 = vfmadd231ps_avx512vl(auVar63,auVar99,auVar55);
          auVar73 = vbroadcasti32x4_avx512vl(*(undefined1 (*) [16])(uVar42 + 0x10 + lVar30));
          local_9e0 = vmovdqa64_avx512vl(auVar73);
          auVar73 = vbroadcasti32x4_avx512vl(*(undefined1 (*) [16])(uVar42 + 0x14 + lVar30));
          auVar65 = vmulps_avx512vl(auVar66,auVar62);
          auVar64 = vmulps_avx512vl(auVar66,auVar64);
          auVar65 = vfmadd231ps_avx512vl(auVar65,auVar99,auVar71);
          auVar64 = vfmadd231ps_fma(auVar64,auVar99,auVar72);
          auVar71 = vmulps_avx512vl(auVar66,auVar68);
          auVar67 = vmulps_avx512vl(auVar66,auVar67);
          auVar72 = vmulps_avx512vl(auVar66,auVar61);
          auVar61 = vfmadd231ps_fma(auVar71,auVar99,auVar14);
          auVar50 = vfmadd231ps_fma(auVar67,auVar99,auVar50);
          auVar71 = vfmadd231ps_fma(auVar72,auVar99,auVar57);
          auVar67 = vmulps_avx512vl(auVar66,auVar70);
          auVar72 = vmulps_avx512vl(auVar66,auVar69);
          auVar69 = vmulps_avx512vl(auVar66,auVar48);
          auVar48 = vfmadd231ps_fma(auVar67,auVar99,auVar60);
          auVar67 = vfmadd231ps_fma(auVar72,auVar99,auVar56);
          auVar58 = vfmadd231ps_fma(auVar69,auVar99,auVar58);
          local_a00 = vmovdqa64_avx512vl(auVar73);
          auVar73 = vinsertf32x4_avx512vl(ZEXT1632(auVar53),auVar61,1);
          auVar74 = vinsertf32x4_avx512vl(ZEXT1632(auVar59),auVar50,1);
          auVar92._16_16_ = auVar71;
          auVar92._0_16_ = auVar49;
          auVar78._16_16_ = auVar63;
          auVar78._0_16_ = auVar63;
          auVar75 = vinsertf32x4_avx512vl(ZEXT1632(auVar65),auVar65,1);
          auVar79._16_16_ = auVar64;
          auVar79._0_16_ = auVar64;
          auVar80._16_16_ = auVar48;
          auVar80._0_16_ = auVar48;
          auVar81._16_16_ = auVar67;
          auVar81._0_16_ = auVar67;
          uVar7 = *(undefined4 *)(ray + k * 4);
          auVar82._4_4_ = uVar7;
          auVar82._0_4_ = uVar7;
          auVar82._8_4_ = uVar7;
          auVar82._12_4_ = uVar7;
          auVar82._16_4_ = uVar7;
          auVar82._20_4_ = uVar7;
          auVar82._24_4_ = uVar7;
          auVar82._28_4_ = uVar7;
          uVar7 = *(undefined4 *)(ray + k * 4 + 0x10);
          auVar83._4_4_ = uVar7;
          auVar83._0_4_ = uVar7;
          auVar83._8_4_ = uVar7;
          auVar83._12_4_ = uVar7;
          auVar83._16_4_ = uVar7;
          auVar83._20_4_ = uVar7;
          auVar83._24_4_ = uVar7;
          auVar83._28_4_ = uVar7;
          uVar7 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar84._4_4_ = uVar7;
          auVar84._0_4_ = uVar7;
          auVar84._8_4_ = uVar7;
          auVar84._12_4_ = uVar7;
          auVar84._16_4_ = uVar7;
          auVar84._20_4_ = uVar7;
          auVar84._24_4_ = uVar7;
          auVar84._28_4_ = uVar7;
          uVar7 = *(undefined4 *)(ray + k * 4 + 0x40);
          auVar95._4_4_ = uVar7;
          auVar95._0_4_ = uVar7;
          auVar95._8_4_ = uVar7;
          auVar95._12_4_ = uVar7;
          auVar95._16_4_ = uVar7;
          auVar95._20_4_ = uVar7;
          auVar95._24_4_ = uVar7;
          auVar95._28_4_ = uVar7;
          auVar76 = vinsertf32x4_avx512vl(ZEXT1632(auVar58),auVar58,1);
          uVar7 = *(undefined4 *)(ray + k * 4 + 0x50);
          auVar96._4_4_ = uVar7;
          auVar96._0_4_ = uVar7;
          auVar96._8_4_ = uVar7;
          auVar96._12_4_ = uVar7;
          auVar96._16_4_ = uVar7;
          auVar96._20_4_ = uVar7;
          auVar96._24_4_ = uVar7;
          auVar96._28_4_ = uVar7;
          fVar11 = *(float *)(ray + k * 4 + 0x60);
          auVar98._4_4_ = fVar11;
          auVar98._0_4_ = fVar11;
          auVar98._8_4_ = fVar11;
          auVar98._12_4_ = fVar11;
          auVar98._16_4_ = fVar11;
          auVar98._20_4_ = fVar11;
          auVar98._24_4_ = fVar11;
          auVar98._28_4_ = fVar11;
          auVar73 = vsubps_avx(auVar73,auVar82);
          auVar74 = vsubps_avx(auVar74,auVar83);
          auVar92 = vsubps_avx(auVar92,auVar84);
          auVar77 = vsubps_avx512vl(auVar78,auVar82);
          auVar78 = vsubps_avx512vl(auVar75,auVar83);
          auVar79 = vsubps_avx512vl(auVar79,auVar84);
          auVar80 = vsubps_avx512vl(auVar80,auVar82);
          auVar75 = vsubps_avx(auVar81,auVar83);
          auVar81 = vsubps_avx512vl(auVar76,auVar84);
          auVar82 = vsubps_avx512vl(auVar80,auVar73);
          auVar76 = vsubps_avx(auVar75,auVar74);
          auVar83 = vsubps_avx512vl(auVar81,auVar92);
          auVar84 = vsubps_avx512vl(auVar73,auVar77);
          auVar85 = vsubps_avx512vl(auVar74,auVar78);
          auVar86 = vsubps_avx512vl(auVar92,auVar79);
          auVar87 = vaddps_avx512vl(auVar80,auVar73);
          auVar94._0_4_ = auVar75._0_4_ + auVar74._0_4_;
          auVar94._4_4_ = auVar75._4_4_ + auVar74._4_4_;
          auVar94._8_4_ = auVar75._8_4_ + auVar74._8_4_;
          auVar94._12_4_ = auVar75._12_4_ + auVar74._12_4_;
          auVar94._16_4_ = auVar75._16_4_ + auVar74._16_4_;
          auVar94._20_4_ = auVar75._20_4_ + auVar74._20_4_;
          auVar94._24_4_ = auVar75._24_4_ + auVar74._24_4_;
          auVar94._28_4_ = auVar75._28_4_ + auVar74._28_4_;
          auVar88 = vaddps_avx512vl(auVar81,auVar92);
          auVar89._4_4_ = auVar83._4_4_ * auVar94._4_4_;
          auVar89._0_4_ = auVar83._0_4_ * auVar94._0_4_;
          auVar89._8_4_ = auVar83._8_4_ * auVar94._8_4_;
          auVar89._12_4_ = auVar83._12_4_ * auVar94._12_4_;
          auVar89._16_4_ = auVar83._16_4_ * auVar94._16_4_;
          auVar89._20_4_ = auVar83._20_4_ * auVar94._20_4_;
          auVar89._24_4_ = auVar83._24_4_ * auVar94._24_4_;
          auVar89._28_4_ = auVar63._12_4_;
          auVar49 = vfmsub231ps_fma(auVar89,auVar76,auVar88);
          auVar90._4_4_ = auVar82._4_4_ * auVar88._4_4_;
          auVar90._0_4_ = auVar82._0_4_ * auVar88._0_4_;
          auVar90._8_4_ = auVar82._8_4_ * auVar88._8_4_;
          auVar90._12_4_ = auVar82._12_4_ * auVar88._12_4_;
          auVar90._16_4_ = auVar82._16_4_ * auVar88._16_4_;
          auVar90._20_4_ = auVar82._20_4_ * auVar88._20_4_;
          auVar90._24_4_ = auVar82._24_4_ * auVar88._24_4_;
          auVar90._28_4_ = auVar88._28_4_;
          auVar48 = vfmsub231ps_fma(auVar90,auVar83,auVar87);
          auVar88._4_4_ = auVar76._4_4_ * auVar87._4_4_;
          auVar88._0_4_ = auVar76._0_4_ * auVar87._0_4_;
          auVar88._8_4_ = auVar76._8_4_ * auVar87._8_4_;
          auVar88._12_4_ = auVar76._12_4_ * auVar87._12_4_;
          auVar88._16_4_ = auVar76._16_4_ * auVar87._16_4_;
          auVar88._20_4_ = auVar76._20_4_ * auVar87._20_4_;
          auVar88._24_4_ = auVar76._24_4_ * auVar87._24_4_;
          auVar88._28_4_ = auVar87._28_4_;
          auVar50 = vfmsub231ps_fma(auVar88,auVar82,auVar94);
          auVar91._0_4_ = fVar11 * auVar50._0_4_;
          auVar91._4_4_ = fVar11 * auVar50._4_4_;
          auVar91._8_4_ = fVar11 * auVar50._8_4_;
          auVar91._12_4_ = fVar11 * auVar50._12_4_;
          auVar91._16_4_ = fVar11 * 0.0;
          auVar91._20_4_ = fVar11 * 0.0;
          auVar91._24_4_ = fVar11 * 0.0;
          auVar91._28_4_ = 0;
          auVar48 = vfmadd231ps_fma(auVar91,auVar96,ZEXT1632(auVar48));
          auVar48 = vfmadd231ps_fma(ZEXT1632(auVar48),auVar95,ZEXT1632(auVar49));
          auVar89 = vaddps_avx512vl(auVar73,auVar77);
          auVar90 = vaddps_avx512vl(auVar74,auVar78);
          auVar88 = vaddps_avx512vl(auVar92,auVar79);
          auVar87 = vmulps_avx512vl(auVar90,auVar86);
          auVar91 = vfmsub231ps_avx512vl(auVar87,auVar85,auVar88);
          auVar87._4_4_ = auVar88._4_4_ * auVar84._4_4_;
          auVar87._0_4_ = auVar88._0_4_ * auVar84._0_4_;
          auVar87._8_4_ = auVar88._8_4_ * auVar84._8_4_;
          auVar87._12_4_ = auVar88._12_4_ * auVar84._12_4_;
          auVar87._16_4_ = auVar88._16_4_ * auVar84._16_4_;
          auVar87._20_4_ = auVar88._20_4_ * auVar84._20_4_;
          auVar87._24_4_ = auVar88._24_4_ * auVar84._24_4_;
          auVar87._28_4_ = auVar88._28_4_;
          auVar88 = vfmsub231ps_avx512vl(auVar87,auVar86,auVar89);
          auVar89 = vmulps_avx512vl(auVar89,auVar85);
          auVar49 = vfmsub231ps_fma(auVar89,auVar84,auVar90);
          auVar89 = vsubps_avx512vl(auVar77,auVar80);
          auVar97._0_4_ = auVar49._0_4_ * fVar11;
          auVar97._4_4_ = auVar49._4_4_ * fVar11;
          auVar97._8_4_ = auVar49._8_4_ * fVar11;
          auVar97._12_4_ = auVar49._12_4_ * fVar11;
          auVar97._16_4_ = fVar11 * 0.0;
          auVar97._20_4_ = fVar11 * 0.0;
          auVar97._24_4_ = fVar11 * 0.0;
          auVar97._28_4_ = 0;
          auVar49 = vfmadd231ps_fma(auVar97,auVar96,auVar88);
          auVar90 = vsubps_avx512vl(auVar78,auVar75);
          local_9a0 = vfmadd231ps_avx512vl(ZEXT1632(auVar49),auVar95,auVar91);
          auVar88 = vsubps_avx512vl(auVar79,auVar81);
          auVar77 = vaddps_avx512vl(auVar77,auVar80);
          auVar75 = vaddps_avx512vl(auVar78,auVar75);
          auVar87 = vaddps_avx512vl(auVar79,auVar81);
          auVar78 = vmulps_avx512vl(auVar75,auVar88);
          auVar78 = vfmsub231ps_avx512vl(auVar78,auVar90,auVar87);
          auVar87 = vmulps_avx512vl(auVar87,auVar89);
          auVar87 = vfmsub231ps_avx512vl(auVar87,auVar88,auVar77);
          auVar77 = vmulps_avx512vl(auVar77,auVar90);
          auVar75 = vfmsub231ps_avx512vl(auVar77,auVar89,auVar75);
          auVar75 = vmulps_avx512vl(auVar75,auVar98);
          auVar75 = vfmadd231ps_avx512vl(auVar75,auVar96,auVar87);
          auVar87 = vfmadd231ps_avx512vl(auVar75,auVar95,auVar78);
          auVar101._0_4_ = local_9a0._0_4_ + auVar48._0_4_;
          auVar101._4_4_ = local_9a0._4_4_ + auVar48._4_4_;
          auVar101._8_4_ = local_9a0._8_4_ + auVar48._8_4_;
          auVar101._12_4_ = local_9a0._12_4_ + auVar48._12_4_;
          auVar101._16_4_ = local_9a0._16_4_ + 0.0;
          auVar101._20_4_ = local_9a0._20_4_ + 0.0;
          auVar101._24_4_ = local_9a0._24_4_ + 0.0;
          auVar101._28_4_ = local_9a0._28_4_ + 0.0;
          local_980 = vaddps_avx512vl(auVar87,auVar101);
          auVar78 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(local_980,auVar78);
          auVar75._8_4_ = 0x34000000;
          auVar75._0_8_ = 0x3400000034000000;
          auVar75._12_4_ = 0x34000000;
          auVar75._16_4_ = 0x34000000;
          auVar75._20_4_ = 0x34000000;
          auVar75._24_4_ = 0x34000000;
          auVar75._28_4_ = 0x34000000;
          auVar75 = vmulps_avx512vl(auVar78,auVar75);
          auVar77 = vminps_avx512vl(ZEXT1632(auVar48),local_9a0);
          auVar79 = vminps_avx512vl(auVar77,auVar87);
          auVar77._8_4_ = 0x80000000;
          auVar77._0_8_ = 0x8000000080000000;
          auVar77._12_4_ = 0x80000000;
          auVar77._16_4_ = 0x80000000;
          auVar77._20_4_ = 0x80000000;
          auVar77._24_4_ = 0x80000000;
          auVar77._28_4_ = 0x80000000;
          auVar77 = vxorps_avx512vl(auVar75,auVar77);
          uVar25 = vcmpps_avx512vl(auVar79,auVar77,5);
          auVar77 = vmaxps_avx512vl(ZEXT1632(auVar48),local_9a0);
          auVar77 = vmaxps_avx512vl(auVar77,auVar87);
          uVar26 = vcmpps_avx512vl(auVar77,auVar75,2);
          bVar45 = (byte)uVar25 | (byte)uVar26;
          auVar75 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          if (bVar45 != 0) {
            auVar77 = vmulps_avx512vl(auVar85,auVar83);
            auVar87 = vmulps_avx512vl(auVar82,auVar86);
            auVar79 = vmulps_avx512vl(auVar84,auVar76);
            auVar80 = vmulps_avx512vl(auVar90,auVar86);
            auVar81 = vmulps_avx512vl(auVar84,auVar88);
            auVar91 = vmulps_avx512vl(auVar89,auVar85);
            auVar76 = vfmsub213ps_avx512vl(auVar76,auVar86,auVar77);
            auVar83 = vfmsub213ps_avx512vl(auVar83,auVar84,auVar87);
            auVar82 = vfmsub213ps_avx512vl(auVar82,auVar85,auVar79);
            auVar88 = vfmsub213ps_avx512vl(auVar88,auVar85,auVar80);
            auVar89 = vfmsub213ps_avx512vl(auVar89,auVar86,auVar81);
            auVar90 = vfmsub213ps_avx512vl(auVar90,auVar84,auVar91);
            vandps_avx512vl(auVar77,auVar78);
            vandps_avx512vl(auVar80,auVar78);
            uVar28 = vcmpps_avx512vl(auVar90,auVar90,1);
            vandps_avx512vl(auVar87,auVar78);
            vandps_avx512vl(auVar81,auVar78);
            uVar29 = vcmpps_avx512vl(auVar90,auVar90,1);
            vandps_avx512vl(auVar79,auVar78);
            vandps_avx512vl(auVar91,auVar78);
            uVar46 = vcmpps_avx512vl(auVar90,auVar90,1);
            bVar44 = (bool)((byte)uVar28 & 1);
            local_960._0_4_ = (float)((uint)bVar44 * auVar76._0_4_ | (uint)!bVar44 * auVar88._0_4_);
            bVar44 = (bool)((byte)(uVar28 >> 1) & 1);
            local_960._4_4_ = (float)((uint)bVar44 * auVar76._4_4_ | (uint)!bVar44 * auVar88._4_4_);
            bVar44 = (bool)((byte)(uVar28 >> 2) & 1);
            local_960._8_4_ = (float)((uint)bVar44 * auVar76._8_4_ | (uint)!bVar44 * auVar88._8_4_);
            bVar44 = (bool)((byte)(uVar28 >> 3) & 1);
            local_960._12_4_ =
                 (float)((uint)bVar44 * auVar76._12_4_ | (uint)!bVar44 * auVar88._12_4_);
            bVar44 = (bool)((byte)(uVar28 >> 4) & 1);
            local_960._16_4_ =
                 (float)((uint)bVar44 * auVar76._16_4_ | (uint)!bVar44 * auVar88._16_4_);
            bVar44 = (bool)((byte)(uVar28 >> 5) & 1);
            local_960._20_4_ =
                 (float)((uint)bVar44 * auVar76._20_4_ | (uint)!bVar44 * auVar88._20_4_);
            bVar44 = (bool)((byte)(uVar28 >> 6) & 1);
            local_960._24_4_ =
                 (float)((uint)bVar44 * auVar76._24_4_ | (uint)!bVar44 * auVar88._24_4_);
            bVar44 = SUB81(uVar28 >> 7,0);
            local_960._28_4_ = (uint)bVar44 * auVar76._28_4_ | (uint)!bVar44 * auVar88._28_4_;
            bVar44 = (bool)((byte)uVar29 & 1);
            local_940._0_4_ = (float)((uint)bVar44 * auVar83._0_4_ | (uint)!bVar44 * auVar89._0_4_);
            bVar44 = (bool)((byte)(uVar29 >> 1) & 1);
            local_940._4_4_ = (float)((uint)bVar44 * auVar83._4_4_ | (uint)!bVar44 * auVar89._4_4_);
            bVar44 = (bool)((byte)(uVar29 >> 2) & 1);
            local_940._8_4_ = (float)((uint)bVar44 * auVar83._8_4_ | (uint)!bVar44 * auVar89._8_4_);
            bVar44 = (bool)((byte)(uVar29 >> 3) & 1);
            local_940._12_4_ =
                 (float)((uint)bVar44 * auVar83._12_4_ | (uint)!bVar44 * auVar89._12_4_);
            bVar44 = (bool)((byte)(uVar29 >> 4) & 1);
            local_940._16_4_ =
                 (float)((uint)bVar44 * auVar83._16_4_ | (uint)!bVar44 * auVar89._16_4_);
            bVar44 = (bool)((byte)(uVar29 >> 5) & 1);
            local_940._20_4_ =
                 (float)((uint)bVar44 * auVar83._20_4_ | (uint)!bVar44 * auVar89._20_4_);
            bVar44 = (bool)((byte)(uVar29 >> 6) & 1);
            local_940._24_4_ =
                 (float)((uint)bVar44 * auVar83._24_4_ | (uint)!bVar44 * auVar89._24_4_);
            bVar44 = SUB81(uVar29 >> 7,0);
            local_940._28_4_ = (uint)bVar44 * auVar83._28_4_ | (uint)!bVar44 * auVar89._28_4_;
            bVar44 = (bool)((byte)uVar46 & 1);
            local_920._0_4_ = (float)((uint)bVar44 * auVar82._0_4_ | (uint)!bVar44 * auVar90._0_4_);
            bVar44 = (bool)((byte)(uVar46 >> 1) & 1);
            local_920._4_4_ = (float)((uint)bVar44 * auVar82._4_4_ | (uint)!bVar44 * auVar90._4_4_);
            bVar44 = (bool)((byte)(uVar46 >> 2) & 1);
            local_920._8_4_ = (float)((uint)bVar44 * auVar82._8_4_ | (uint)!bVar44 * auVar90._8_4_);
            bVar44 = (bool)((byte)(uVar46 >> 3) & 1);
            local_920._12_4_ =
                 (float)((uint)bVar44 * auVar82._12_4_ | (uint)!bVar44 * auVar90._12_4_);
            bVar44 = (bool)((byte)(uVar46 >> 4) & 1);
            local_920._16_4_ =
                 (float)((uint)bVar44 * auVar82._16_4_ | (uint)!bVar44 * auVar90._16_4_);
            bVar44 = (bool)((byte)(uVar46 >> 5) & 1);
            local_920._20_4_ =
                 (float)((uint)bVar44 * auVar82._20_4_ | (uint)!bVar44 * auVar90._20_4_);
            bVar44 = (bool)((byte)(uVar46 >> 6) & 1);
            local_920._24_4_ =
                 (float)((uint)bVar44 * auVar82._24_4_ | (uint)!bVar44 * auVar90._24_4_);
            bVar44 = SUB81(uVar46 >> 7,0);
            local_920._28_4_ = (uint)bVar44 * auVar82._28_4_ | (uint)!bVar44 * auVar90._28_4_;
            auVar76._4_4_ = fVar11 * local_920._4_4_;
            auVar76._0_4_ = fVar11 * local_920._0_4_;
            auVar76._8_4_ = fVar11 * local_920._8_4_;
            auVar76._12_4_ = fVar11 * local_920._12_4_;
            auVar76._16_4_ = fVar11 * local_920._16_4_;
            auVar76._20_4_ = fVar11 * local_920._20_4_;
            auVar76._24_4_ = fVar11 * local_920._24_4_;
            auVar76._28_4_ = fVar11;
            auVar49 = vfmadd213ps_fma(auVar96,local_940,auVar76);
            auVar49 = vfmadd213ps_fma(auVar95,local_960,ZEXT1632(auVar49));
            auVar76 = ZEXT1632(CONCAT412(auVar49._12_4_ + auVar49._12_4_,
                                         CONCAT48(auVar49._8_4_ + auVar49._8_4_,
                                                  CONCAT44(auVar49._4_4_ + auVar49._4_4_,
                                                           auVar49._0_4_ + auVar49._0_4_))));
            auVar85._0_4_ = auVar92._0_4_ * local_920._0_4_;
            auVar85._4_4_ = auVar92._4_4_ * local_920._4_4_;
            auVar85._8_4_ = auVar92._8_4_ * local_920._8_4_;
            auVar85._12_4_ = auVar92._12_4_ * local_920._12_4_;
            auVar85._16_4_ = auVar92._16_4_ * local_920._16_4_;
            auVar85._20_4_ = auVar92._20_4_ * local_920._20_4_;
            auVar85._24_4_ = auVar92._24_4_ * local_920._24_4_;
            auVar85._28_4_ = 0;
            auVar49 = vfmadd213ps_fma(auVar74,local_940,auVar85);
            auVar50 = vfmadd213ps_fma(auVar73,local_960,ZEXT1632(auVar49));
            auVar73 = vrcp14ps_avx512vl(auVar76);
            auVar74 = vfnmadd213ps_avx512vl(auVar73,auVar76,auVar75);
            auVar49 = vfmadd132ps_fma(auVar74,auVar73,auVar73);
            local_8a0 = ZEXT1632(CONCAT412((auVar50._12_4_ + auVar50._12_4_) * auVar49._12_4_,
                                           CONCAT48((auVar50._8_4_ + auVar50._8_4_) * auVar49._8_4_,
                                                    CONCAT44((auVar50._4_4_ + auVar50._4_4_) *
                                                             auVar49._4_4_,
                                                             (auVar50._0_4_ + auVar50._0_4_) *
                                                             auVar49._0_4_))));
            uVar7 = *(undefined4 *)(ray + k * 4 + 0x30);
            auVar73._4_4_ = uVar7;
            auVar73._0_4_ = uVar7;
            auVar73._8_4_ = uVar7;
            auVar73._12_4_ = uVar7;
            auVar73._16_4_ = uVar7;
            auVar73._20_4_ = uVar7;
            auVar73._24_4_ = uVar7;
            auVar73._28_4_ = uVar7;
            uVar25 = vcmpps_avx512vl(local_8a0,auVar73,0xd);
            uVar7 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar74._4_4_ = uVar7;
            auVar74._0_4_ = uVar7;
            auVar74._8_4_ = uVar7;
            auVar74._12_4_ = uVar7;
            auVar74._16_4_ = uVar7;
            auVar74._20_4_ = uVar7;
            auVar74._24_4_ = uVar7;
            auVar74._28_4_ = uVar7;
            uVar26 = vcmpps_avx512vl(local_8a0,auVar74,2);
            bVar45 = (byte)uVar25 & (byte)uVar26 & bVar45;
            if (bVar45 != 0) {
              uVar28 = vcmpps_avx512vl(auVar76,_DAT_02020f00,4);
              uVar28 = bVar45 & uVar28;
              if ((char)uVar28 != '\0') {
                local_9c0 = ZEXT1632(auVar48);
                local_900 = (char)uVar28;
                local_820 = 0xf0;
                auVar86._8_4_ = 0x219392ef;
                auVar86._0_8_ = 0x219392ef219392ef;
                auVar86._12_4_ = 0x219392ef;
                auVar86._16_4_ = 0x219392ef;
                auVar86._20_4_ = 0x219392ef;
                auVar86._24_4_ = 0x219392ef;
                auVar86._28_4_ = 0x219392ef;
                uVar29 = vcmpps_avx512vl(auVar78,auVar86,5);
                auVar73 = vrcp14ps_avx512vl(local_980);
                auVar74 = vfnmadd213ps_avx512vl(local_980,auVar73,auVar75);
                auVar74 = vfmadd132ps_avx512vl(auVar74,auVar73,auVar73);
                fVar1 = (float)((uint)((byte)uVar29 & 1) * auVar74._0_4_);
                fVar2 = (float)((uint)((byte)(uVar29 >> 1) & 1) * auVar74._4_4_);
                fVar3 = (float)((uint)((byte)(uVar29 >> 2) & 1) * auVar74._8_4_);
                fVar4 = (float)((uint)((byte)(uVar29 >> 3) & 1) * auVar74._12_4_);
                fVar5 = (float)((uint)((byte)(uVar29 >> 4) & 1) * auVar74._16_4_);
                fVar6 = (float)((uint)((byte)(uVar29 >> 5) & 1) * auVar74._20_4_);
                fVar11 = (float)((uint)((byte)(uVar29 >> 6) & 1) * auVar74._24_4_);
                auVar93._0_4_ = fVar1 * auVar48._0_4_;
                auVar93._4_4_ = fVar2 * auVar48._4_4_;
                auVar93._8_4_ = fVar3 * auVar48._8_4_;
                auVar93._12_4_ = fVar4 * auVar48._12_4_;
                auVar93._16_4_ = fVar5 * 0.0;
                auVar93._20_4_ = fVar6 * 0.0;
                auVar93._24_4_ = fVar11 * 0.0;
                auVar93._28_4_ = 0;
                auVar74 = vminps_avx512vl(auVar93,auVar75);
                auVar27._4_4_ = local_9a0._4_4_ * fVar2;
                auVar27._0_4_ = local_9a0._0_4_ * fVar1;
                auVar27._8_4_ = local_9a0._8_4_ * fVar3;
                auVar27._12_4_ = local_9a0._12_4_ * fVar4;
                auVar27._16_4_ = local_9a0._16_4_ * fVar5;
                auVar27._20_4_ = local_9a0._20_4_ * fVar6;
                auVar27._24_4_ = local_9a0._24_4_ * fVar11;
                auVar27._28_4_ = auVar73._28_4_;
                auVar73 = vminps_avx512vl(auVar27,auVar75);
                auVar92 = vsubps_avx512vl(auVar75,auVar74);
                auVar75 = vsubps_avx512vl(auVar75,auVar73);
                local_8c0 = vblendps_avx(auVar73,auVar92,0xf0);
                local_8e0 = vblendps_avx(auVar74,auVar75,0xf0);
                fVar11 = (float)DAT_02060940;
                fVar6 = DAT_02060940._4_4_;
                fVar5 = DAT_02060940._8_4_;
                fVar1 = DAT_02060940._12_4_;
                fVar4 = DAT_02060940._16_4_;
                fVar3 = DAT_02060940._20_4_;
                fVar2 = DAT_02060940._24_4_;
                local_860._4_4_ = local_940._4_4_ * fVar6;
                local_860._0_4_ = local_940._0_4_ * fVar11;
                local_860._8_4_ = local_940._8_4_ * fVar5;
                local_860._12_4_ = local_940._12_4_ * fVar1;
                local_860._16_4_ = local_940._16_4_ * fVar4;
                local_860._20_4_ = local_940._20_4_ * fVar3;
                local_860._24_4_ = local_940._24_4_ * fVar2;
                local_860._28_4_ = local_940._28_4_;
                local_880[0] = local_960._0_4_ * fVar11;
                local_880[1] = local_960._4_4_ * fVar6;
                local_880[2] = local_960._8_4_ * fVar5;
                local_880[3] = local_960._12_4_ * fVar1;
                fStack_870 = local_960._16_4_ * fVar4;
                fStack_86c = local_960._20_4_ * fVar3;
                fStack_868 = local_960._24_4_ * fVar2;
                uStack_864 = local_8e0._28_4_;
                local_840._4_4_ = local_920._4_4_ * fVar6;
                local_840._0_4_ = local_920._0_4_ * fVar11;
                local_840._8_4_ = local_920._8_4_ * fVar5;
                local_840._12_4_ = local_920._12_4_ * fVar1;
                local_840._16_4_ = local_920._16_4_ * fVar4;
                local_840._20_4_ = local_920._20_4_ * fVar3;
                local_840._24_4_ = local_920._24_4_ * fVar2;
                local_840._28_4_ = local_8e0._28_4_;
                do {
                  local_ae0 = auVar103._0_16_;
                  local_af0 = auVar104._0_16_;
                  uVar29 = 0;
                  for (uVar46 = uVar28; (uVar46 & 1) == 0; uVar46 = uVar46 >> 1 | 0x8000000000000000
                      ) {
                    uVar29 = uVar29 + 1;
                  }
                  pGVar17 = (pSVar15->geometries).items[*(uint *)(local_9e0 + uVar29 * 4)].ptr;
                  if ((pGVar17->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                    uVar28 = uVar28 ^ 1L << (uVar29 & 0x3f);
                    bVar44 = true;
                  }
                  else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                          (pGVar17->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                    bVar44 = false;
                  }
                  else {
                    uVar7 = *(undefined4 *)(ray + k * 4 + 0x80);
                    uVar46 = (ulong)(uint)((int)uVar29 * 4);
                    uVar12 = *(undefined4 *)(local_8e0 + uVar46);
                    local_a60._4_4_ = uVar12;
                    local_a60._0_4_ = uVar12;
                    local_a60._8_4_ = uVar12;
                    local_a60._12_4_ = uVar12;
                    uVar12 = *(undefined4 *)(local_8c0 + uVar46);
                    local_a50._4_4_ = uVar12;
                    local_a50._0_4_ = uVar12;
                    local_a50._8_4_ = uVar12;
                    local_a50._12_4_ = uVar12;
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_8a0 + uVar46);
                    local_ad0.context = context->user;
                    local_a30 = vpbroadcastd_avx512vl();
                    uVar12 = *(undefined4 *)(local_a00 + uVar46);
                    local_a40._4_4_ = uVar12;
                    local_a40._0_4_ = uVar12;
                    local_a40._8_4_ = uVar12;
                    local_a40._12_4_ = uVar12;
                    uVar12 = *(undefined4 *)((long)local_880 + uVar46);
                    local_a90._4_4_ = uVar12;
                    local_a90._0_4_ = uVar12;
                    local_a90._8_4_ = uVar12;
                    local_a90._12_4_ = uVar12;
                    uVar12 = *(undefined4 *)(local_860 + uVar46);
                    local_a80._4_4_ = uVar12;
                    local_a80._0_4_ = uVar12;
                    local_a80._8_4_ = uVar12;
                    local_a80._12_4_ = uVar12;
                    uVar12 = *(undefined4 *)(local_840 + uVar46);
                    local_a70._4_4_ = uVar12;
                    local_a70._0_4_ = uVar12;
                    local_a70._8_4_ = uVar12;
                    local_a70._12_4_ = uVar12;
                    vpcmpeqd_avx2(ZEXT1632(local_a30),ZEXT1632(local_a30));
                    uStack_a1c = (local_ad0.context)->instID[0];
                    local_a20 = uStack_a1c;
                    uStack_a18 = uStack_a1c;
                    uStack_a14 = uStack_a1c;
                    uStack_a10 = (local_ad0.context)->instPrimID[0];
                    uStack_a0c = uStack_a10;
                    uStack_a08 = uStack_a10;
                    uStack_a04 = uStack_a10;
                    local_b20 = local_aa0._0_8_;
                    uStack_b18 = local_aa0._8_8_;
                    local_ad0.valid = (int *)&local_b20;
                    local_ad0.geometryUserPtr = pGVar17->userPtr;
                    local_ad0.hit = local_a90;
                    local_ad0.N = 4;
                    local_ad0.ray = (RTCRayN *)ray;
                    if (pGVar17->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar17->occlusionFilterN)(&local_ad0);
                      auVar104 = ZEXT1664(local_af0);
                      auVar103 = ZEXT1664(local_ae0);
                    }
                    auVar48._8_8_ = uStack_b18;
                    auVar48._0_8_ = local_b20;
                    uVar46 = vptestmd_avx512vl(auVar48,auVar48);
                    if ((uVar46 & 0xf) == 0) {
                      bVar44 = true;
                    }
                    else {
                      p_Var20 = context->args->filter;
                      if ((p_Var20 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar17->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var20)(&local_ad0);
                        auVar104 = ZEXT1664(local_af0);
                        auVar103 = ZEXT1664(local_ae0);
                      }
                      auVar72._8_8_ = uStack_b18;
                      auVar72._0_8_ = local_b20;
                      uVar46 = vptestmd_avx512vl(auVar72,auVar72);
                      uVar46 = uVar46 & 0xf;
                      auVar48 = *(undefined1 (*) [16])(local_ad0.ray + 0x80);
                      auVar49 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                      bVar44 = (bool)((byte)uVar46 & 1);
                      auVar69._0_4_ = (uint)bVar44 * auVar49._0_4_ | (uint)!bVar44 * auVar48._0_4_;
                      bVar44 = (bool)((byte)(uVar46 >> 1) & 1);
                      auVar69._4_4_ = (uint)bVar44 * auVar49._4_4_ | (uint)!bVar44 * auVar48._4_4_;
                      bVar44 = (bool)((byte)(uVar46 >> 2) & 1);
                      auVar69._8_4_ = (uint)bVar44 * auVar49._8_4_ | (uint)!bVar44 * auVar48._8_4_;
                      bVar44 = SUB81(uVar46 >> 3,0);
                      auVar69._12_4_ =
                           (uint)bVar44 * auVar49._12_4_ | (uint)!bVar44 * auVar48._12_4_;
                      *(undefined1 (*) [16])(local_ad0.ray + 0x80) = auVar69;
                      bVar44 = (byte)uVar46 == 0;
                    }
                    if (bVar44) {
                      *(undefined4 *)(ray + k * 4 + 0x80) = uVar7;
                      uVar28 = uVar28 ^ 1L << (uVar29 & 0x3f);
                    }
                  }
                  uVar41 = 0;
                  if (!bVar44) {
                    if (bVar43) {
                      *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                      uVar41 = 1;
                    }
                    goto LAB_00783006;
                  }
                } while (uVar28 != 0);
              }
            }
          }
          uVar41 = 0;
          local_b08 = local_b08 + 1;
          bVar43 = local_b08 < local_b10;
        } while (local_b08 != local_b10);
      }
    }
LAB_00783006:
  } while ((uVar41 & 3) == 0);
  return local_b00 != &local_800;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }